

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.hpp
# Opt level: O0

type jsoncons::detail::to_integer<signed_char,char>(char *s,size_t length,char *n)

{
  char cVar1;
  byte bVar2;
  char *ptr_;
  byte *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar3;
  uchar *in_RSI;
  char *in_RDI;
  type tVar4;
  type tVar5;
  type ru;
  U u;
  bool is_negative;
  byte local_2a;
  char *in_stack_fffffffffffffff0;
  to_integer_errc local_8;
  
  *in_RDX = 0;
  if (in_RSI == (uchar *)0x0) {
    to_integer_result<signed_char,_char>::to_integer_result
              ((to_integer_result<signed_char,_char> *)&stack0xfffffffffffffff0,in_RDI,
               invalid_number);
    uVar3 = extraout_RDX;
  }
  else {
    cVar1 = *in_RDI;
    if (cVar1 == '-') {
      in_RDI = in_RDI + 1;
      in_RSI = in_RSI + -1;
    }
    tVar4 = to_integer<unsigned_char,char>(in_stack_fffffffffffffff0,(size_t)in_RDI,in_RSI);
    ptr_ = tVar4.ptr;
    if (tVar4.ec == success) {
      if (cVar1 == '-') {
        cVar1 = ext_traits::integer_limits<signed_char,_void>::lowest();
        if ((-(cVar1 + 1) & 0xffU) + 1 < (uint)local_2a) {
          to_integer_result<signed_char,_char>::to_integer_result
                    ((to_integer_result<signed_char,_char> *)&stack0xfffffffffffffff0,ptr_,overflow)
          ;
          uVar3 = extraout_RDX_01;
        }
        else {
          *in_RDX = -local_2a;
          to_integer_result<signed_char,_char>::to_integer_result
                    ((to_integer_result<signed_char,_char> *)&stack0xfffffffffffffff0,ptr_,success);
          uVar3 = extraout_RDX_02;
        }
      }
      else {
        bVar2 = ext_traits::integer_limits<signed_char,_void>::max();
        if (bVar2 < local_2a) {
          to_integer_result<signed_char,_char>::to_integer_result
                    ((to_integer_result<signed_char,_char> *)&stack0xfffffffffffffff0,ptr_,overflow)
          ;
          uVar3 = extraout_RDX_03;
        }
        else {
          *in_RDX = local_2a;
          to_integer_result<signed_char,_char>::to_integer_result
                    ((to_integer_result<signed_char,_char> *)&stack0xfffffffffffffff0,ptr_,success);
          uVar3 = extraout_RDX_04;
        }
      }
    }
    else {
      to_integer_result<signed_char,_char>::to_integer_result
                ((to_integer_result<signed_char,_char> *)&stack0xfffffffffffffff0,ptr_,tVar4.ec);
      uVar3 = extraout_RDX_00;
    }
  }
  tVar5._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  tVar5.ec = local_8;
  tVar5.ptr = in_stack_fffffffffffffff0;
  return tVar5;
}

Assistant:

typename std::enable_if<ext_traits::integer_limits<T>::is_specialized && ext_traits::integer_limits<T>::is_signed,to_integer_result<T,CharT>>::type
to_integer(const CharT* s, std::size_t length, T& n)
{
    n = 0;

    if (length == 0)
    {
        return to_integer_result<T,CharT>(s, to_integer_errc::invalid_number);
    }

    bool is_negative = *s == '-' ? true : false;
    if (is_negative)
    {
        ++s;
        --length;
    }

    using U = typename ext_traits::make_unsigned<T>::type;

    U u;
    auto ru = to_integer(s, length, u);
    if (ru.ec != to_integer_errc())
    {
        return to_integer_result<T,CharT>(ru.ptr, ru.ec);
    }
    if (is_negative)
    {
        if (u > static_cast<U>(-((ext_traits::integer_limits<T>::lowest)()+T(1))) + U(1))
        {
            return to_integer_result<T,CharT>(ru.ptr, to_integer_errc::overflow);
        }
        else
        {
            n = static_cast<T>(U(0) - u);
            return to_integer_result<T,CharT>(ru.ptr, to_integer_errc());
        }
    }
    else
    {
        if (u > static_cast<U>((ext_traits::integer_limits<T>::max)()))
        {
            return to_integer_result<T,CharT>(ru.ptr, to_integer_errc::overflow);
        }
        else
        {
            n = static_cast<T>(u);
            return to_integer_result<T,CharT>(ru.ptr, to_integer_errc());
        }
    }
}